

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation_statement.cpp
# Opt level: O2

void __thiscall
duckdb::RelationStatement::RelationStatement
          (RelationStatement *this,shared_ptr<duckdb::Relation,_true> *relation_p)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Relation *pRVar3;
  
  SQLStatement::SQLStatement(&this->super_SQLStatement,RELATION_STATEMENT);
  (this->super_SQLStatement)._vptr_SQLStatement = (_func_int **)&PTR__RelationStatement_0178fa98;
  (this->relation).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (relation_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (relation_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (relation_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->relation).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar1;
  (this->relation).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  (relation_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  pRVar3 = shared_ptr<duckdb::Relation,_true>::operator->(&this->relation);
  if (pRVar3->type == QUERY_RELATION) {
    shared_ptr<duckdb::Relation,_true>::operator->(&this->relation);
    ::std::__cxx11::string::_M_assign((string *)&(this->super_SQLStatement).query);
  }
  return;
}

Assistant:

RelationStatement::RelationStatement(shared_ptr<Relation> relation_p)
    : SQLStatement(StatementType::RELATION_STATEMENT), relation(std::move(relation_p)) {
	if (relation->type == RelationType::QUERY_RELATION) {
		auto &query_relation = relation->Cast<QueryRelation>();
		query = query_relation.query;
	}
}